

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBufferTestUtil.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Functional::BufferTestUtil::VertexArrayVerifier::verify
          (VertexArrayVerifier *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  CallLogWrapper *pCVar1;
  long *plVar2;
  ulong uVar3;
  GLuint program;
  RenderContext *context;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  RGBA RVar8;
  RGBA RVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  uchar *puVar13;
  bool bVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  undefined4 extraout_var;
  undefined8 *puVar19;
  TextureFormat *pTVar20;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 extraout_RAX_01;
  undefined8 uVar21;
  TextureFormat TVar22;
  unsigned_short uVar23;
  int iVar24;
  int iVar25;
  byte bVar26;
  uint uVar27;
  long lVar28;
  ulong uVar29;
  uint uVar30;
  uint uVar31;
  void *pvVar32;
  int x;
  int y;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  Vec4 v10;
  Vec4 v00;
  Vec4 v01;
  string imageSetDesc;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> positions;
  Vec4 v11;
  RGBA threshold;
  Vec4 color;
  vector<unsigned_short,_std::allocator<unsigned_short>_> indices;
  Surface reference;
  Surface rendered;
  PixelBufferAccess dstAccess;
  undefined8 local_338;
  undefined8 uStack_330;
  long local_328;
  undefined8 uStack_320;
  ulong local_318;
  CallLogWrapper *local_310;
  TextureFormat local_308;
  TextureFormat TStack_300;
  ulong local_2f8;
  TextureFormat TStack_2f0;
  undefined8 local_2e8;
  float fStack_2e0;
  float fStack_2dc;
  ulong local_2d8 [2];
  long *local_2c8;
  undefined8 local_2c0;
  long local_2b8;
  undefined8 uStack_2b0;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> local_2a8;
  uchar *local_290;
  ulong local_288;
  TextureFormat local_280;
  long lStack_278;
  ulong local_270 [2];
  int local_260;
  uint local_25c;
  int local_258;
  int local_254;
  int local_250;
  RGBA local_24c;
  Vec4 local_248;
  ulong local_238 [2];
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_228;
  uchar *local_210;
  size_t local_208;
  ulong local_200;
  ulong local_1f8;
  Surface local_1f0;
  Surface local_1d8;
  ulong local_1c0;
  uchar *local_1b8;
  ulong local_1b0;
  PixelBufferAccess local_1a8 [2];
  ios_base local_138 [264];
  int *piVar18;
  
  local_290 = tbs;
  local_210 = sig;
  local_208 = siglen;
  iVar15 = (*((this->super_BufferVerifierBase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  piVar18 = (int *)CONCAT44(extraout_var,iVar15);
  iVar15 = *piVar18;
  iVar24 = iVar15 + 7;
  if (-1 < iVar15) {
    iVar24 = iVar15;
  }
  iVar25 = piVar18[1];
  uVar17 = iVar24 >> 3;
  if (0x7f < iVar24 >> 3) {
    uVar17 = 0x80;
  }
  local_318 = (ulong)uVar17;
  iVar24 = iVar25 + 7;
  if (-1 < iVar25) {
    iVar24 = iVar25;
  }
  uVar17 = iVar24 >> 3;
  if (0x7f < iVar24 >> 3) {
    uVar17 = 0x80;
  }
  bVar26 = 8 - (char)piVar18[2];
  uVar16 = 0x1000000 << (8U - (char)piVar18[5] & 0x1f);
  if (piVar18[5] < 1) {
    uVar16 = 0;
  }
  uVar31 = 0x100 << (8U - (char)piVar18[3] & 0x1f) | 1 << (bVar26 & 0x1f);
  uVar16 = 0x10000 << (8U - (char)piVar18[4] & 0x1f) | uVar31 | uVar16;
  uVar30 = 1 << (bVar26 & 0x1f) & 0xff;
  if (0xfa < uVar30) {
    uVar30 = 0xfb;
  }
  program = (this->m_program->m_program).m_program;
  uVar31 = uVar31 >> 8 & 0xff;
  if (0xfa < uVar31) {
    uVar31 = 0xfb;
  }
  uVar27 = uVar16 >> 0x10 & 0xff;
  if (0xfa < uVar27) {
    uVar27 = 0xfb;
  }
  uVar16 = uVar16 >> 0x18;
  if (0xfa < uVar16) {
    uVar16 = 0xfb;
  }
  local_24c.m_value = uVar16 * 0x1000000 + (uVar27 << 0x10 | uVar31 << 8 | uVar30) + 0x4040404;
  local_2a8.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2a8.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a8.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_228.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_228.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  tcu::Surface::Surface(&local_1d8);
  tcu::Surface::Surface(&local_1f0);
  uVar16 = uVar17 * (int)local_318;
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::resize
            (&local_2a8,(long)(int)(uVar16 * 4));
  if (7 < iVar25) {
    fVar33 = (float)(int)local_318;
    uVar30 = 0;
    do {
      if (7 < iVar15) {
        fVar34 = (float)(int)uVar30 / (float)(int)uVar17;
        fVar36 = (float)(int)(uVar30 + 1) / (float)(int)uVar17;
        fVar34 = fVar34 + fVar34 + -1.0;
        fVar36 = fVar36 + fVar36 + -1.0;
        iVar24 = uVar30 * (int)local_318 * 4;
        uVar29 = 0;
        do {
          iVar25 = (int)uVar29;
          uVar29 = uVar29 + 1;
          fVar38 = (float)iVar25 / fVar33;
          fVar37 = (float)(int)uVar29 / fVar33;
          fVar38 = fVar38 + fVar38 + -1.0;
          fVar37 = fVar37 + fVar37 + -1.0;
          local_2a8.
          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
          .super__Vector_impl_data._M_start[iVar24].m_data[0] = fVar38;
          local_2a8.
          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
          .super__Vector_impl_data._M_start[iVar24].m_data[1] = fVar34;
          local_2a8.
          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
          .super__Vector_impl_data._M_start[iVar24 + 1].m_data[0] = fVar38;
          local_2a8.
          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
          .super__Vector_impl_data._M_start[iVar24 + 1].m_data[1] = fVar36;
          local_2a8.
          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
          .super__Vector_impl_data._M_start[iVar24 + 2].m_data[0] = fVar37;
          local_2a8.
          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
          .super__Vector_impl_data._M_start[iVar24 + 2].m_data[1] = fVar34;
          local_2a8.
          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
          .super__Vector_impl_data._M_start[iVar24 + 3].m_data[0] = fVar37;
          local_2a8.
          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
          .super__Vector_impl_data._M_start[iVar24 + 3].m_data[1] = fVar36;
          iVar24 = iVar24 + 4;
        } while ((local_318 & 0xffffffff) != uVar29);
      }
      uVar30 = uVar30 + 1;
    } while (uVar30 != uVar17);
  }
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (&local_228,(long)(int)(uVar16 * 6));
  if (0 < (int)uVar16) {
    uVar23 = 3;
    lVar28 = 0;
    do {
      iVar15 = (int)lVar28;
      local_228.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start[iVar15] = uVar23 - 1;
      local_228.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start[iVar15 + 1] = uVar23 - 3;
      local_228.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start[iVar15 + 2] = uVar23 - 2;
      local_228.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start[iVar15 + 3] = uVar23 - 1;
      local_228.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start[iVar15 + 4] = uVar23 - 2;
      local_228.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start[iVar15 + 5] = uVar23;
      lVar28 = lVar28 + 6;
      uVar23 = uVar23 + 4;
    } while ((ulong)uVar16 * 6 != lVar28);
  }
  pCVar1 = &(this->super_BufferVerifierBase).super_CallLogWrapper;
  glu::CallLogWrapper::glBindBuffer(pCVar1,0x8893,0);
  glu::CallLogWrapper::glBindBuffer(pCVar1,0x8892,0);
  glu::CallLogWrapper::glViewport(pCVar1,0,0,(int)local_318 * 8,uVar17 << 3);
  glu::CallLogWrapper::glClearColor(pCVar1,0.0,0.0,0.0,1.0);
  glu::CallLogWrapper::glUseProgram(pCVar1,program);
  glu::CallLogWrapper::glEnableVertexAttribArray(pCVar1,this->m_posLoc);
  glu::CallLogWrapper::glVertexAttribPointer
            (pCVar1,this->m_posLoc,2,0x1406,'\0',0,
             local_2a8.
             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
             _M_impl.super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glEnableVertexAttribArray(pCVar1,this->m_byteVecLoc);
  glu::CallLogWrapper::glBindBuffer(pCVar1,0x8892,(GLuint)ctx);
  local_25c = uVar16 * 0xc;
  local_260 = (int)local_290 + -0xc;
  local_210 = local_210 + (int)local_208;
  iVar15 = 0;
  local_310 = pCVar1;
  do {
    uVar17 = (int)local_290 - iVar15;
    iVar24 = iVar15;
    if (uVar17 == 0 || (int)local_290 < iVar15) break;
    uVar16 = 0xc;
    iVar24 = local_260;
    if ((0xb < (int)uVar17) &&
       (uVar30 = uVar17 / 0xc, uVar16 = uVar30 * 0xc, iVar24 = iVar15, uVar17 = uVar16,
       SBORROW4(local_25c,uVar16) != (int)(local_25c + uVar30 * -0xc) < 0)) {
      uVar16 = local_25c;
      uVar17 = local_25c;
    }
    local_200 = (ulong)uVar17;
    uVar17 = (int)uVar16 / 0xc;
    iVar25 = (int)local_318;
    local_1f8 = (ulong)uVar17;
    if (iVar25 < (int)uVar17) {
      local_1f8 = local_318 & 0xffffffff;
    }
    local_250 = ((int)uVar17 / iVar25 + 1) - (uint)((int)uVar17 % iVar25 == 0);
    local_2e8 = local_2d8;
    local_254 = iVar15;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"Bytes ","");
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    iVar15 = iVar24 + (int)local_208;
    std::ostream::operator<<((ostringstream *)local_1a8,iVar15);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar29 = 0xf;
    if (local_2e8 != local_2d8) {
      uVar29 = local_2d8[0];
    }
    uVar3 = lStack_278 + CONCAT44(fStack_2dc,fStack_2e0);
    if (uVar29 < uVar3) {
      uVar29 = 0xf;
      if ((ulong *)CONCAT44(local_280.type,local_280.order) != local_270) {
        uVar29 = local_270[0];
      }
      if (uVar29 < uVar3) goto LAB_00fe4c0e;
      puVar19 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_280,0,(char *)0x0,(ulong)local_2e8);
    }
    else {
LAB_00fe4c0e:
      puVar19 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_2e8,CONCAT44(local_280.type,local_280.order));
    }
    local_338 = &local_328;
    plVar2 = puVar19 + 2;
    if ((long *)*puVar19 == plVar2) {
      local_328 = *plVar2;
      uStack_320 = puVar19[3];
    }
    else {
      local_328 = *plVar2;
      local_338 = (long *)*puVar19;
    }
    uStack_330 = puVar19[1];
    *puVar19 = plVar2;
    puVar19[1] = 0;
    *(undefined1 *)plVar2 = 0;
    pTVar20 = (TextureFormat *)std::__cxx11::string::append((char *)&local_338);
    local_308 = (TextureFormat)&local_2f8;
    TVar22 = (TextureFormat)(pTVar20 + 2);
    if (*pTVar20 == TVar22) {
      local_2f8 = *(ulong *)TVar22;
      TStack_2f0 = pTVar20[3];
    }
    else {
      local_2f8 = *(ulong *)TVar22;
      local_308 = *pTVar20;
    }
    TStack_300 = pTVar20[1];
    *pTVar20 = TVar22;
    pTVar20[1].order = R;
    pTVar20[1].type = SNORM_INT8;
    *(undefined1 *)&pTVar20[2].order = R;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::ostream::operator<<((ostringstream *)local_1a8,iVar15 + uVar16 + -1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar29 = 0xf;
    if (local_308 != (TextureFormat)&local_2f8) {
      uVar29 = local_2f8;
    }
    uVar3 = CONCAT44(local_248.m_data[3],local_248.m_data[2]) + (long)TStack_300;
    if (uVar29 < uVar3) {
      uVar29 = 0xf;
      if ((ulong *)CONCAT44(local_248.m_data[1],local_248.m_data[0]) != local_238) {
        uVar29 = local_238[0];
      }
      if (uVar29 < uVar3) goto LAB_00fe4d74;
      puVar19 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_248,0,(char *)0x0,(ulong)local_308);
    }
    else {
LAB_00fe4d74:
      puVar19 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_308,CONCAT44(local_248.m_data[1],local_248.m_data[0]));
    }
    local_2c8 = &local_2b8;
    plVar2 = puVar19 + 2;
    if ((long *)*puVar19 == plVar2) {
      local_2b8 = *plVar2;
      uStack_2b0 = puVar19[3];
    }
    else {
      local_2b8 = *plVar2;
      local_2c8 = (long *)*puVar19;
    }
    local_2c0 = puVar19[1];
    *puVar19 = plVar2;
    puVar19[1] = 0;
    *(undefined1 *)plVar2 = 0;
    if ((ulong *)CONCAT44(local_248.m_data[1],local_248.m_data[0]) != local_238) {
      operator_delete((ulong *)CONCAT44(local_248.m_data[1],local_248.m_data[0]),local_238[0] + 1);
    }
    if (local_308 != (TextureFormat)&local_2f8) {
      operator_delete((void *)local_308,local_2f8 + 1);
    }
    if (local_338 != &local_328) {
      operator_delete(local_338,local_328 + 1);
    }
    if ((ulong *)CONCAT44(local_280.type,local_280.order) != local_270) {
      operator_delete((ulong *)CONCAT44(local_280.type,local_280.order),local_270[0] + 1);
    }
    if (local_2e8 != local_2d8) {
      operator_delete(local_2e8,local_2d8[0] + 1);
    }
    glu::CallLogWrapper::glClear(local_310,0x4000);
    glu::CallLogWrapper::glVertexAttribPointer
              (local_310,this->m_byteVecLoc,3,0x1401,'\x01',0,(void *)(long)iVar15);
    glu::CallLogWrapper::glDrawElements
              (local_310,4,uVar17 * 6,0x1403,
               local_228.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
               .super__Vector_impl_data._M_start);
    iVar15 = (int)local_1f8;
    iVar25 = iVar15 * 8;
    tcu::Surface::setSize
              (&local_1f0,iVar25,
               (((int)uVar17 / iVar15 + 1) - (uint)((int)uVar17 % iVar15 == 0)) * 8);
    local_308.order = RGBA;
    local_308.type = UNORM_INT8;
    pvVar32 = (void *)local_1f0.m_pixels.m_cap;
    if ((void *)local_1f0.m_pixels.m_cap != (void *)0x0) {
      pvVar32 = local_1f0.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              (local_1a8,&local_308,local_1f0.m_width,local_1f0.m_height,1,pvVar32);
    local_308.order = R;
    local_308.type = SNORM_INT8;
    TStack_300.order = R;
    TStack_300.type = 0xff;
    tcu::clear(local_1a8,(IVec4 *)&local_308);
    local_258 = iVar25;
    if (0xb < (int)uVar16) {
      local_1b8 = local_210 + iVar24;
      local_1c0 = (ulong)uVar17;
      uVar29 = 0;
      do {
        puVar13 = local_1b8;
        lVar28 = (long)(int)local_1f8;
        uVar3 = (ulong)(uint)((int)uVar29 >> 0x1f) << 0x20 | uVar29 & 0xffffffff;
        local_288 = (long)uVar3 / lVar28 & 0xffffffff;
        iVar15 = (int)uVar29 * 0xc;
        local_338 = (long *)(CONCAT44(local_338._4_4_,
                                      (uint)CONCAT12(local_1b8[(long)iVar15 + 2],
                                                     *(undefined2 *)(local_1b8 + iVar15))) |
                            0xff000000);
        local_1b0 = uVar29;
        tcu::RGBA::toVec((RGBA *)&local_338);
        local_2e8 = (ulong *)(CONCAT44(local_2e8._4_4_,
                                       (uint)CONCAT12(puVar13[(long)iVar15 + 5],
                                                      *(undefined2 *)(puVar13 + (long)iVar15 + 3)))
                             | 0xff000000);
        tcu::RGBA::toVec((RGBA *)&local_2e8);
        local_280.order =
             CONCAT12(puVar13[(long)(iVar15 + 6) + 2],*(undefined2 *)(puVar13 + (iVar15 + 6))) |
             0xff000000;
        tcu::RGBA::toVec((RGBA *)&local_280);
        local_248.m_data[0] =
             (float)(CONCAT12(puVar13[(long)(iVar15 + 9) + 2],
                              *(undefined2 *)(puVar13 + (iVar15 + 9))) | 0xff000000);
        tcu::RGBA::toVec((RGBA *)&local_248);
        local_288 = (ulong)(uint)((int)local_288 << 3);
        iVar15 = 0;
        do {
          fVar33 = ((float)iVar15 + 0.5) * 0.125;
          iVar24 = (int)local_288;
          iVar25 = 0;
          do {
            fVar34 = ((float)iVar25 + 0.5) * 0.125;
            bVar14 = 1.0 < fVar33 + fVar34;
            pTVar20 = &local_308;
            if (bVar14) {
              pTVar20 = &local_280;
            }
            fVar35 = fVar33;
            fVar36 = local_338._4_4_;
            RVar8.m_value = local_338._0_4_;
            fVar37 = uStack_330._4_4_;
            fVar38 = (float)uStack_330;
            RVar9.m_value = local_2e8._0_4_;
            fVar10 = local_2e8._4_4_;
            fVar11 = fStack_2e0;
            fVar12 = fStack_2dc;
            if (bVar14) {
              fVar34 = 1.0 - fVar34;
              fVar35 = 1.0 - fVar33;
              fVar36 = local_2e8._4_4_;
              RVar8.m_value = local_2e8._0_4_;
              fVar37 = fStack_2dc;
              fVar38 = fStack_2e0;
              RVar9.m_value = local_338._0_4_;
              fVar10 = local_338._4_4_;
              fVar11 = (float)uStack_330;
              fVar12 = uStack_330._4_4_;
            }
            fVar4 = (float)pTVar20->order;
            fVar5 = (float)pTVar20->type;
            fVar6 = (float)pTVar20[1].order;
            fVar7 = (float)pTVar20[1].type;
            local_248.m_data[0] =
                 fVar35 * ((float)RVar8.m_value - fVar4) +
                 fVar34 * ((float)RVar9.m_value - fVar4) + fVar4;
            local_248.m_data[1] = fVar35 * (fVar36 - fVar5) + fVar34 * (fVar10 - fVar5) + fVar5;
            local_248.m_data[2] = fVar35 * (fVar38 - fVar6) + fVar34 * (fVar11 - fVar6) + fVar6;
            local_248.m_data[3] = fVar35 * (fVar37 - fVar7) + fVar34 * (fVar12 - fVar7) + fVar7;
            tcu::PixelBufferAccess::setPixel
                      (local_1a8,&local_248,(int)((long)uVar3 % lVar28) * 8 + iVar25,iVar15 + iVar24
                       ,0);
            iVar25 = iVar25 + 1;
          } while (iVar25 != 8);
          iVar15 = iVar15 + 1;
        } while (iVar15 != 8);
        uVar29 = local_1b0 + 1;
      } while (uVar29 != local_1c0);
    }
    tcu::Surface::setSize(&local_1d8,local_258,local_250 << 3);
    context = ((this->super_BufferVerifierBase).m_context)->m_renderCtx;
    local_308.order = RGBA;
    local_308.type = UNORM_INT8;
    pvVar32 = (void *)local_1d8.m_pixels.m_cap;
    if ((void *)local_1d8.m_pixels.m_cap != (void *)0x0) {
      pvVar32 = local_1d8.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              (local_1a8,&local_308,local_1d8.m_width,local_1d8.m_height,1,pvVar32);
    glu::readPixels(context,0,0,local_1a8);
    bVar14 = tcu::pixelThresholdCompare
                       (((this->super_BufferVerifierBase).m_context)->m_testCtx->m_log,
                        "RenderResult",(char *)local_2c8,&local_1f0,&local_1d8,&local_24c,
                        COMPARE_LOG_RESULT);
    if (local_2c8 != &local_2b8) {
      operator_delete(local_2c8,local_2b8 + 1);
    }
    iVar15 = (int)local_200 + local_254;
    iVar24 = local_254;
  } while (bVar14);
  pCVar1 = local_310;
  glu::CallLogWrapper::glDisableVertexAttribArray(local_310,this->m_posLoc);
  glu::CallLogWrapper::glDisableVertexAttribArray(pCVar1,this->m_byteVecLoc);
  tcu::Surface::~Surface(&local_1f0);
  tcu::Surface::~Surface(&local_1d8);
  uVar21 = extraout_RAX;
  if (local_228.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_228.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_228.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_228.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
    uVar21 = extraout_RAX_00;
  }
  if (local_2a8.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2a8.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2a8.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a8.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    uVar21 = extraout_RAX_01;
  }
  return (int)CONCAT71((int7)((ulong)uVar21 >> 8),(int)local_290 <= iVar24);
}

Assistant:

bool VertexArrayVerifier::verify (deUint32 buffer, const deUint8* refPtr, int offset, int numBytes)
{
	const tcu::RenderTarget&	renderTarget		= m_context.getRenderContext().getRenderTarget();
	const int					numBytesInVtx		= 3;
	const int					numBytesInQuad		= numBytesInVtx*4;
	int							maxQuadsX			= de::min(128, renderTarget.getWidth()	/ VERIFY_QUAD_SIZE);
	int							maxQuadsY			= de::min(128, renderTarget.getHeight()	/ VERIFY_QUAD_SIZE);
	int							maxQuadsPerBatch	= maxQuadsX*maxQuadsY;
	int							numVerified			= 0;
	deUint32					program				= m_program->getProgram();
	tcu::RGBA					threshold			= renderTarget.getPixelFormat().getColorThreshold() + tcu::RGBA(4,4,4,4);
	bool						isOk				= true;

	vector<tcu::Vec2>			positions;
	vector<deUint16>			indices;

	tcu::Surface				rendered;
	tcu::Surface				reference;

	DE_ASSERT(numBytes >= numBytesInQuad); // Can't render full quad with smaller buffers.

	computePositions(positions, maxQuadsX, maxQuadsY);
	computeIndices(indices, maxQuadsX, maxQuadsY);

	// Reset buffer bindings.
	glBindBuffer				(GL_ELEMENT_ARRAY_BUFFER,	0);
	glBindBuffer				(GL_ARRAY_BUFFER,			0);

	// Setup rendering state.
	glViewport					(0, 0, maxQuadsX*VERIFY_QUAD_SIZE, maxQuadsY*VERIFY_QUAD_SIZE);
	glClearColor				(0.0f, 0.0f, 0.0f, 1.0f);
	glUseProgram				(program);
	glEnableVertexAttribArray	(m_posLoc);
	glVertexAttribPointer		(m_posLoc, 2, GL_FLOAT, GL_FALSE, 0, &positions[0]);
	glEnableVertexAttribArray	(m_byteVecLoc);
	glBindBuffer				(GL_ARRAY_BUFFER, buffer);

	while (numVerified < numBytes)
	{
		int		numRemaining		= numBytes-numVerified;
		bool	isLeftoverBatch		= numRemaining < numBytesInQuad;
		int		numBytesToVerify	= isLeftoverBatch ? numBytesInQuad				: de::min(maxQuadsPerBatch*numBytesInQuad, numRemaining - numRemaining%numBytesInQuad);
		int		curOffset			= isLeftoverBatch ? (numBytes-numBytesInQuad)	: numVerified;
		int		numQuads			= numBytesToVerify/numBytesInQuad;
		int		numCols				= de::min(maxQuadsX, numQuads);
		int		numRows				= numQuads/maxQuadsX + (numQuads%maxQuadsX != 0 ? 1 : 0);
		string	imageSetDesc		= string("Bytes ") + de::toString(offset+curOffset) + " to " + de::toString(offset+curOffset+numBytesToVerify-1);

		DE_ASSERT(numBytesToVerify > 0 && numBytesToVerify%numBytesInQuad == 0);
		DE_ASSERT(de::inBounds(curOffset, 0, numBytes));
		DE_ASSERT(de::inRange(curOffset+numBytesToVerify, curOffset, numBytes));

		// Render batch.
		glClear					(GL_COLOR_BUFFER_BIT);
		glVertexAttribPointer	(m_byteVecLoc, 3, GL_UNSIGNED_BYTE, GL_TRUE, 0, (const glw::GLvoid*)(deUintptr)(offset + curOffset));
		glDrawElements			(GL_TRIANGLES, numQuads*6, GL_UNSIGNED_SHORT, &indices[0]);

		renderQuadGridReference(reference,  numQuads, numCols, refPtr + offset + curOffset);

		rendered.setSize(numCols*VERIFY_QUAD_SIZE, numRows*VERIFY_QUAD_SIZE);
		glu::readPixels(m_context.getRenderContext(), 0, 0, rendered.getAccess());

		if (!tcu::pixelThresholdCompare(m_context.getTestContext().getLog(), "RenderResult", imageSetDesc.c_str(), reference, rendered, threshold, tcu::COMPARE_LOG_RESULT))
		{
			isOk = false;
			break;
		}

		numVerified += isLeftoverBatch ? numRemaining : numBytesToVerify;
	}

	glDisableVertexAttribArray	(m_posLoc);
	glDisableVertexAttribArray	(m_byteVecLoc);

	return isOk;
}